

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

double __thiscall slang::SVInt::pow(SVInt *this,double __x,double __y)

{
  uint bits;
  SVInt *pSVar1;
  bool bVar2;
  logic_t lVar3;
  bitwidth_t bVar4;
  bitwidth_t bVar5;
  byte bVar6;
  SVInt *pSVar7;
  SVInt *in_RDX;
  SVInt *in_RSI;
  SVInt *this_00;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  uint64_t uStack_50;
  SVInt SStack_48;
  SVInt local_38;
  
  this_00 = &SStack_48;
  if (((in_RSI->super_SVIntStorage).unknownFlag != false) ||
     ((in_RDX->super_SVIntStorage).unknownFlag == true)) {
LAB_0054ad39:
    createFillX(this,(in_RSI->super_SVIntStorage).bitWidth,(in_RSI->super_SVIntStorage).signFlag);
    return extraout_XMM0_Qa;
  }
  bVar4 = getActiveBits(in_RSI);
  bVar5 = getActiveBits(in_RDX);
  if (bVar4 == 0) {
    if (bVar5 != 0) {
      if (((in_RDX->super_SVIntStorage).signFlag == true) && (bVar2 = isNegative(in_RDX), bVar2))
      goto LAB_0054ad39;
      bVar4 = (in_RSI->super_SVIntStorage).bitWidth;
      bVar6 = (in_RSI->super_SVIntStorage).signFlag;
LAB_0054adfc:
      uStack_50 = 0;
      goto LAB_0054ae12;
    }
LAB_0054ae03:
    bVar4 = (in_RSI->super_SVIntStorage).bitWidth;
    bVar6 = (in_RSI->super_SVIntStorage).signFlag;
  }
  else {
    if (bVar4 == 1 || bVar5 == 0) goto LAB_0054ae03;
    if (((((in_RSI->super_SVIntStorage).signFlag != true) || (bVar2 = isNegative(in_RSI), !bVar2))
        || (lVar3 = reductionAnd(in_RSI), lVar3.value == '\0')) ||
       ((lVar3.value == '@' || (lVar3.value == 0x80)))) {
      if ((in_RDX->super_SVIntStorage).signFlag == false) {
        bVar6 = (in_RSI->super_SVIntStorage).signFlag;
      }
      else {
        bVar2 = isNegative(in_RDX);
        bVar6 = (in_RSI->super_SVIntStorage).signFlag;
        if (bVar2) {
          bVar4 = (in_RSI->super_SVIntStorage).bitWidth;
          bVar6 = bVar6 & 1;
          goto LAB_0054adfc;
        }
      }
      if (((bVar6 & 1) != 0) && (bVar2 = isNegative(in_RSI), bVar2)) {
        bVar2 = isOdd(in_RDX);
        if (bVar2) {
          operator-(&local_38);
          modPow(&SStack_48,&local_38,in_RDX,(in_RSI->super_SVIntStorage).signFlag);
          operator-(this);
          ~SVInt(&SStack_48);
          this_00 = &local_38;
        }
        else {
          operator-(&SStack_48);
          modPow(this,&SStack_48,in_RDX,(in_RSI->super_SVIntStorage).signFlag);
          this_00 = &SStack_48;
        }
LAB_0054af0f:
        ~SVInt(this_00);
        return extraout_XMM0_Qa_02;
      }
      if (bVar4 == 2) {
        pSVar1 = (SVInt *)(in_RSI->super_SVIntStorage).field_0.val;
        pSVar7 = in_RSI;
        if (((in_RSI->super_SVIntStorage).unknownFlag & 1U) != 0) {
          pSVar7 = pSVar1;
        }
        bits = (in_RSI->super_SVIntStorage).bitWidth;
        if (0x40 < bits) {
          pSVar7 = pSVar1;
        }
        bVar6 = (in_RSI->super_SVIntStorage).signFlag;
        if ((pSVar7->super_SVIntStorage).field_0.val == 2) {
          SVInt(&SStack_48,bits,1,(bool)(bVar6 & 1));
          shl(this,&SStack_48);
          goto LAB_0054af0f;
        }
      }
      else {
        bVar6 = (in_RSI->super_SVIntStorage).signFlag;
      }
      modPow(this,in_RSI,in_RDX,(bool)(bVar6 & 1));
      return extraout_XMM0_Qa_01;
    }
    bVar2 = isOdd(in_RDX);
    bVar4 = (in_RSI->super_SVIntStorage).bitWidth;
    bVar6 = (in_RSI->super_SVIntStorage).signFlag;
    if (bVar2) {
      uStack_50 = 0xffffffffffffffff;
      goto LAB_0054ae12;
    }
  }
  uStack_50 = 1;
LAB_0054ae12:
  SVInt(this,bVar4,uStack_50,(bool)bVar6);
  return extraout_XMM0_Qa_00;
}

Assistant:

SVInt SVInt::pow(const SVInt& rhs) const {
    // ignore unknowns
    if (unknownFlag || rhs.unknownFlag)
        return createFillX(bitWidth, signFlag);

    // Handle special cases first (note that the result always has
    // the bit width of *this)
    bitwidth_t lhsBits = getActiveBits();
    bitwidth_t rhsBits = rhs.getActiveBits();
    // The second operand of the power operator shall be treated as self-determined
    if (lhsBits == 0) {
        if (rhsBits == 0) // 0**0 == 1
            return SVInt(bitWidth, 1, signFlag);
        if (rhs.signFlag && rhs.isNegative()) // 0**-y == x
            return createFillX(bitWidth, signFlag);
        // 0**y == 0
        return SVInt(bitWidth, 0, signFlag);
    }

    // x**0 == 1 || 1**y == 1
    if (rhsBits == 0 || lhsBits == 1)
        return SVInt(bitWidth, 1, signFlag);

    if (signFlag && isNegative()) {
        if (reductionAnd()) { // x == -1
            // if rhs is odd, result is -1
            // otherwise, result is 1
            if (rhs.isOdd())
                return SVInt(bitWidth, UINT64_MAX, signFlag);
            else
                return SVInt(bitWidth, 1, signFlag);
        }
    }

    if (rhs.signFlag && rhs.isNegative()) // x**-y == 0
        return SVInt(bitWidth, 0, signFlag);

    // we have one of two cases left (rhs is always positive here):
    // 1. lhs > 1 (just do the operation)
    // 2. lhs < -1 (invert, do the op, figure out the sign at the end)
    if (signFlag && isNegative()) {
        // result is negative if rhs is odd, otherwise positive
        if (rhs.isOdd())
            return -modPow(-(*this), rhs, signFlag);
        else
            return modPow(-(*this), rhs, signFlag);
    }

    // Optimization for the common case of 2**y
    if (lhsBits == 2 && getRawData()[0] == 2)
        return SVInt(bitWidth, 1, signFlag).shl(rhs);

    return modPow(*this, rhs, signFlag);
}